

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O1

QVariant * __thiscall
QAbstractProxyModel::headerData
          (QVariant *__return_storage_ptr__,QAbstractProxyModel *this,int section,
          Orientation orientation,int role)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *puStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (orientation == Horizontal) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    puStack_48 = (undefined1 *)0x0;
    iVar3 = (**(code **)(*(long *)this + 0x78))(this);
    if (0 < iVar3) {
      puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = 0xffffffffffffffff;
      local_68 = 0;
      uStack_60 = 0;
      (**(code **)(*(long *)this + 0x60))(&local_58,this,0,section);
      (**(code **)(*(long *)this + 400))(&local_70,this,&local_58);
      section = local_70._4_4_;
    }
  }
  else {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    puStack_48 = (undefined1 *)0x0;
    iVar3 = (**(code **)(*(long *)this + 0x80))(this);
    if (0 < iVar3) {
      puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = 0xffffffffffffffff;
      local_68 = 0;
      uStack_60 = 0;
      (**(code **)(*(long *)this + 0x60))(&local_58,this,section,0);
      (**(code **)(*(long *)this + 400))(&local_70,this,&local_58);
      section = (int)local_70;
    }
  }
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           *)(lVar1 + 0xd8));
  plVar2 = *(long **)(lVar1 + 0xd8);
  (**(code **)(*plVar2 + 0xa0))(__return_storage_ptr__,plVar2,section,orientation,role);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractProxyModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QAbstractProxyModel);
    int sourceSection = section;
    if (orientation == Qt::Horizontal) {
        if (rowCount() > 0) {
            const QModelIndex proxyIndex = index(0, section);
            sourceSection = mapToSource(proxyIndex).column();
        }
    } else {
        if (columnCount() > 0) {
            const QModelIndex proxyIndex = index(section, 0);
            sourceSection = mapToSource(proxyIndex).row();
        }
    }
    return d->model->headerData(sourceSection, orientation, role);
}